

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SequenceWithMatchExpr::serializeTo
          (SequenceWithMatchExpr *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  bool bVar2;
  SequenceRepetition *this_00;
  iterator ppEVar3;
  Expression *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  string_view local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  SequenceWithMatchExpr *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"expr");
  ASTSerializer::write(serializer,(int)local_28._M_len,local_28._M_str,(size_t)this->expr);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->repetition);
  pAVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"repetition")
    ;
    ASTSerializer::writeProperty(pAVar1,local_38);
    this_00 = std::optional<slang::ast::SequenceRepetition>::operator->(&this->repetition);
    SequenceRepetition::serializeTo(this_00,local_18);
  }
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"matchItems");
  ASTSerializer::startArray(pAVar1,___range2);
  __end2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin(&this->matchItems);
  ppEVar3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            end(&this->matchItems);
  for (; __end2 != ppEVar3; __end2 = __end2 + 1) {
    ASTSerializer::serialize(local_18,*__end2);
  }
  ASTSerializer::endArray(local_18);
  return;
}

Assistant:

void SequenceWithMatchExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("expr", expr);
    if (repetition) {
        serializer.writeProperty("repetition");
        repetition->serializeTo(serializer);
    }

    serializer.startArray("matchItems");
    for (auto item : matchItems)
        serializer.serialize(*item);
    serializer.endArray();
}